

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_decorations.cpp
# Opt level: O3

spv_result_t spvtools::val::ValidateDecorations(ValidationState_t *vstate)

{
  _Tuple_impl<0UL,_spv::Decoration,_unsigned_int> *p_Var1;
  map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
  *this;
  CapabilitySet *this_00;
  ushort uVar2;
  uint16_t uVar3;
  uint16_t uVar4;
  uint32_t decoration;
  _Head_base<0UL,_spv::Decoration,_false> id;
  _Head_base<1UL,_unsigned_int,_false> _Var5;
  _Rb_tree_color _Var6;
  __hashtable *p_Var7;
  pointer pFVar8;
  __node_base _Var9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  StorageClass SVar13;
  MatrixLayout MVar14;
  uint uVar15;
  uint32_t uVar16;
  MatrixLayout MVar17;
  uint32_t uVar18;
  Op OVar19;
  undefined4 uVar20;
  MemoryModel MVar21;
  spv_result_t sVar22;
  uint *puVar23;
  vector<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>
  *pvVar24;
  pointer pIVar25;
  set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
  *psVar26;
  Instruction *pIVar27;
  _Rb_tree_node_base *p_Var28;
  MatrixLayout *pMVar29;
  Instruction *pIVar30;
  DiagnosticStream *pDVar31;
  char *pcVar32;
  iterator iVar33;
  long lVar34;
  iterator iVar35;
  vector<spvtools::val::Function,_std::allocator<spvtools::val::Function>_> *pvVar36;
  size_t sVar37;
  mapped_type *pmVar38;
  _Base_ptr p_Var39;
  ostream *poVar40;
  __hashtable *p_Var41;
  _Tuple_impl<0UL,_spv::Decoration,_unsigned_int> _Var42;
  ValidationState_t *pVVar43;
  Decoration decoration_00;
  int iVar44;
  __hashtable *p_Var45;
  ValidationState_t *pVVar46;
  char *decoration_str;
  Instruction *unaff_RBX;
  pointer puVar47;
  void *pvVar48;
  __hashtable *p_Var49;
  pointer pIVar50;
  _Hash_node_base *p_Var51;
  char *pcVar52;
  __hashtable *p_Var53;
  uint uVar54;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  pos;
  _Base_ptr p_Var55;
  pointer this_01;
  undefined1 scalar_block_layout;
  _Rb_tree_header *p_Var56;
  char cVar57;
  bool bVar58;
  bool bVar59;
  pair<std::__detail::_Node_iterator<spvtools::val::Instruction_*,_true,_false>,_bool> pVar60;
  pair<std::__detail::_Node_iterator<spv::BuiltIn,_true,_false>,_bool> pVar61;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar62;
  pair<std::_Rb_tree_iterator<std::tuple<spv::Decoration,_unsigned_int>_>,_bool> pVar63;
  pair<std::_Rb_tree_iterator<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>_>,_bool>
  pVar64;
  Instruction *local_5a8;
  string linkage_name;
  Instruction *var_instr;
  _Rb_tree_node_base *local_560;
  ulong local_558;
  ulong local_550;
  unordered_set<spv::BuiltIn,_std::hash<spv::BuiltIn>,_std::equal_to<spv::BuiltIn>,_std::allocator<spv::BuiltIn>_>
  output_var_builtin;
  __hashtable *__h;
  __hashtable *__h_2;
  PerIDKey k;
  undefined1 auStack_4f0 [16];
  code *local_4e0;
  undefined4 local_4d8;
  uint local_4c4;
  Instruction *local_4c0;
  pointer local_4b8;
  __hashtable *__h_1;
  map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
  *local_4a8;
  Instruction *local_4a0;
  pointer local_498;
  unordered_set<spv::BuiltIn,_std::hash<spv::BuiltIn>,_std::equal_to<spv::BuiltIn>,_std::allocator<spv::BuiltIn>_>
  input_var_builtin;
  BuiltIn builtin;
  _Head_base<0UL,_spv::Decoration,_false> _Stack_454;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vStack_450;
  undefined4 local_438;
  uint ep_id;
  undefined4 uStack_424;
  pointer puStack_420;
  pointer local_418;
  ulong local_410;
  __hashtable *__h_3;
  AssemblyGrammar *local_400;
  _Any_data local_3f8;
  code *local_3e8;
  code *local_3e0;
  undefined1 local_3d0 [8];
  undefined1 local_3c8 [24];
  undefined4 local_3b0;
  spv_result_t local_200;
  uint *local_1f8;
  uint *local_1f0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1e8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1c8;
  unordered_set<spvtools::val::Instruction_*,_std::hash<spvtools::val::Instruction_*>,_std::equal_to<spvtools::val::Instruction_*>,_std::allocator<spvtools::val::Instruction_*>_>
  seen_vars;
  ios_base local_138 [264];
  
  local_5a8 = unaff_RBX;
  for (p_Var51 = (vstate->global_vars_)._M_h._M_before_begin._M_nxt;
      p_Var51 != (_Hash_node_base *)0x0; p_Var51 = p_Var51->_M_nxt) {
    uVar18 = *(uint32_t *)&p_Var51[1]._M_nxt;
    local_5a8 = ValidationState_t::FindDef(vstate,uVar18);
    if (((long)(local_5a8->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)(local_5a8->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start == 0x14) &&
       (bVar10 = anon_unknown_0::hasImportLinkageAttribute(uVar18,vstate), bVar10)) {
      ValidationState_t::diag((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_ID,local_5a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_3d0,
                 "A module-scope OpVariable with initialization value cannot be marked with the Import Linkage Type."
                 ,0x62);
      sVar22 = local_200;
      local_5a8 = (Instruction *)(ulong)(uint)local_200;
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3d0);
      if (sVar22 != SPV_SUCCESS) {
        return sVar22;
      }
      break;
    }
  }
  puVar23 = (vstate->entry_points_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_1f8 = (vstate->entry_points_).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish;
  decoration_00 = (Decoration)vstate;
  if (puVar23 != local_1f8) {
    this = &vstate->id_decorations_;
    this_00 = &vstate->module_capabilities_;
    local_400 = &vstate->grammar_;
    do {
      local_558 = (ulong)*puVar23;
      local_1f0 = puVar23;
      pvVar24 = ValidationState_t::entry_point_descriptions(vstate,*puVar23);
      pIVar27 = (Instruction *)
                (pvVar24->
                super__Vector_base<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>
                )._M_impl.super__Vector_impl_data._M_start;
      local_4c0 = (Instruction *)
                  (pvVar24->
                  super__Vector_base<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
      if (pIVar27 != local_4c0) {
        __h_1 = (__hashtable *)((ulong)__h_1 & 0xffffffff00000000);
        local_560 = (_Rb_tree_node_base *)((ulong)local_560 & 0xffffffff00000000);
        __h = (__hashtable *)0x0;
        local_4c4 = 0;
        local_4a8 = (map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
                     *)((ulong)local_4a8 & 0xffffffff00000000);
        do {
          seen_vars._M_h._M_buckets = &seen_vars._M_h._M_single_bucket;
          seen_vars._M_h._M_bucket_count = 1;
          seen_vars._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          seen_vars._M_h._M_element_count = 0;
          seen_vars._M_h._M_rehash_policy._M_max_load_factor = 1.0;
          seen_vars._M_h._M_rehash_policy._M_next_resize = 0;
          seen_vars._M_h._M_single_bucket = (__node_base_ptr)0x0;
          input_var_builtin._M_h._M_buckets = &input_var_builtin._M_h._M_single_bucket;
          input_var_builtin._M_h._M_bucket_count = 1;
          input_var_builtin._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          input_var_builtin._M_h._M_element_count = 0;
          input_var_builtin._M_h._M_rehash_policy._M_max_load_factor = 1.0;
          input_var_builtin._M_h._M_rehash_policy._M_next_resize = 0;
          input_var_builtin._M_h._M_single_bucket = (__node_base_ptr)0x0;
          output_var_builtin._M_h._M_buckets = &output_var_builtin._M_h._M_single_bucket;
          output_var_builtin._M_h._M_bucket_count = 1;
          output_var_builtin._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          output_var_builtin._M_h._M_element_count = 0;
          output_var_builtin._M_h._M_rehash_policy._M_max_load_factor = 1.0;
          output_var_builtin._M_h._M_rehash_policy._M_next_resize = 0;
          output_var_builtin._M_h._M_single_bucket = (__node_base_ptr)0x0;
          pIVar25 = (pointer)(pIVar27->operands_).
                             super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
          local_4b8 = (pointer)(pIVar27->operands_).
                               super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_4a0 = pIVar27;
          if (pIVar25 != local_4b8) {
            do {
              uVar15 = *(uint *)&(pIVar25->words_).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start;
              local_550 = (ulong)uVar15;
              local_498 = pIVar25;
              var_instr = ValidationState_t::FindDef(vstate,uVar15);
              if (var_instr == (Instruction *)0x0) {
LAB_001b5fae:
                ValidationState_t::diag
                          ((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_ID,var_instr);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_3d0,
                           "Interfaces passed to OpEntryPoint must be variables. Found Op",0x3d);
                linkage_name._M_dataplus._M_p = spvOpcodeString((uint)(var_instr->inst_).opcode);
                pDVar31 = DiagnosticStream::operator<<
                                    ((DiagnosticStream *)local_3d0,(char **)&linkage_name);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar31,".",1);
                sVar22 = pDVar31->error_;
LAB_001b61f3:
                DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3d0);
LAB_001b663c:
                local_5a8 = (Instruction *)(ulong)(uint)sVar22;
                bVar10 = false;
                goto LAB_001b6645;
              }
              uVar2 = (var_instr->inst_).opcode;
              pVVar43 = (ValidationState_t *)(ulong)uVar2;
              if ((uVar2 != 0x3b) && (uVar2 != 0x1142)) goto LAB_001b5fae;
              SVar13 = Instruction::GetOperandAs<spv::StorageClass>(var_instr,2);
              if (0x103ff < vstate->version_) {
                if (SVar13 == Function) {
                  ValidationState_t::diag
                            ((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_ID,var_instr);
                  lVar34 = 0x39;
                  pcVar52 = "OpEntryPoint interfaces should only list global variables";
                  goto LAB_001b658a;
                }
                local_3d0 = (undefined1  [8])&seen_vars;
                pVar60 = std::
                         _Hashtable<spvtools::val::Instruction*,spvtools::val::Instruction*,std::allocator<spvtools::val::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::val::Instruction*>,std::hash<spvtools::val::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                         ::
                         _M_insert<spvtools::val::Instruction*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spvtools::val::Instruction*,false>>>>
                                   ((_Hashtable<spvtools::val::Instruction*,spvtools::val::Instruction*,std::allocator<spvtools::val::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::val::Instruction*>,std::hash<spvtools::val::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                                     *)local_3d0,&var_instr,local_3d0);
                if (((undefined1  [16])pVar60 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                goto LAB_001b551a;
                ValidationState_t::diag
                          ((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_ID,var_instr);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_3d0,"Non-unique OpEntryPoint interface ",0x22);
                ValidationState_t::getIdName_abi_cxx11_(&linkage_name,vstate,(uint32_t)local_550);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_3d0,linkage_name._M_dataplus._M_p,
                           linkage_name._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_3d0," is disallowed",0xe);
                sVar22 = local_200;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)linkage_name._M_dataplus._M_p != &linkage_name.field_2) {
                  operator_delete(linkage_name._M_dataplus._M_p,
                                  CONCAT71(linkage_name.field_2._M_allocated_capacity._1_7_,
                                           linkage_name.field_2._M_local_buf[0]) + 1);
                }
LAB_001b6632:
                DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3d0);
                goto LAB_001b663c;
              }
              if ((SVar13 & ~StorageClassUniform) != Input) {
                ValidationState_t::diag
                          ((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_ID,var_instr);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_3d0,
                           "OpEntryPoint interfaces must be OpVariables with Storage Class of Input(1) or Output(3). Found Storage Class "
                           ,0x6d);
                std::ostream::_M_insert<unsigned_long>((ulong)local_3d0);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_3d0," for Entry Point id ",0x14);
                std::ostream::_M_insert<unsigned_long>((ulong)local_3d0);
                lVar34 = 1;
                pcVar52 = ".";
                goto LAB_001b658a;
              }
LAB_001b551a:
              puVar47 = (var_instr->words_).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              if (uVar2 == 0x1142) {
                pMVar29 = puVar47 + 4;
              }
              else {
                pIVar27 = ValidationState_t::FindDef(vstate,puVar47[1]);
                pMVar29 = (pIVar27->words_).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start + 3;
              }
              MVar17 = *pMVar29;
              pIVar27 = ValidationState_t::FindDef(vstate,MVar17);
              MVar14 = (MatrixLayout)local_550;
              if (pIVar27 == (Instruction *)0x0) {
                bVar10 = false;
              }
              else {
                bVar10 = (pIVar27->inst_).opcode == 0x1e;
                if (bVar10) {
                  MVar14 = MVar17;
                }
              }
              local_3d0._0_4_ = MVar14;
              pmVar38 = std::
                        map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
                        ::operator[](this,(key_type_conflict *)local_3d0);
              p_Var39 = (pmVar38->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
              p_Var56 = &(pmVar38->_M_t)._M_impl.super__Rb_tree_header;
              if ((_Rb_tree_header *)p_Var39 != p_Var56) {
                bVar11 = false;
                do {
                  if (p_Var39[1]._M_color == 0xb) {
                    bVar58 = spvIsVulkanEnv(vstate->context_->target_env);
                    bVar11 = true;
                    if (bVar58) {
                      if (p_Var39[1]._M_color != 0xb) {
                        __assert_fail("dec_type_ == spv::Decoration::BuiltIn",
                                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/decoration.h"
                                      ,0x4f,
                                      "spv::BuiltIn spvtools::val::Decoration::builtin() const");
                      }
                      builtin = (p_Var39[1]._M_parent)->_M_color;
                      if (SVar13 == Output) {
                        local_3d0 = (undefined1  [8])&output_var_builtin;
                        pVar61 = std::
                                 _Hashtable<spv::BuiltIn,spv::BuiltIn,std::allocator<spv::BuiltIn>,std::__detail::_Identity,std::equal_to<spv::BuiltIn>,std::hash<spv::BuiltIn>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                                 ::
                                 _M_insert<spv::BuiltIn_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spv::BuiltIn,false>>>>
                                           ((_Hashtable<spv::BuiltIn,spv::BuiltIn,std::allocator<spv::BuiltIn>,std::__detail::_Identity,std::equal_to<spv::BuiltIn>,std::hash<spv::BuiltIn>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                                             *)local_3d0,&builtin,local_3d0);
                        if (((undefined1  [16])pVar61 & (undefined1  [16])0x1) ==
                            (undefined1  [16])0x0) {
                          ValidationState_t::diag
                                    ((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_ID,
                                     var_instr);
                          ValidationState_t::VkErrorID_abi_cxx11_
                                    (&linkage_name,vstate,0x25bb,(char *)0x0);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_3d0,linkage_name._M_dataplus._M_p,
                                     linkage_name._M_string_length);
                          lVar34 = 0x36;
                          pcVar52 = "OpEntryPoint contains duplicate output variables with ";
LAB_001b60d2:
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_3d0,pcVar52,lVar34);
                          k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int>.
                          super__Tuple_impl<1UL,_unsigned_int>.
                          super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                               (_Head_base<1UL,_unsigned_int,_false>)0x0;
                          k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int>.
                          super__Head_base<0UL,_spv::Decoration,_false>._M_head_impl =
                               DecorationRelaxedPrecision;
                          sVar22 = AssemblyGrammar::lookupOperand
                                             (local_400,SPV_OPERAND_TYPE_BUILT_IN,builtin,
                                              (spv_operand_desc *)&k);
                          _Var42 = (_Tuple_impl<0UL,_spv::Decoration,_unsigned_int>)
                                   ((long)"Dim TileImageDataEXT requires format Unknown" + 0x25);
                          if (k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int> !=
                              (_Tuple_impl<0UL,_spv::Decoration,_unsigned_int>)0x0 &&
                              sVar22 == SPV_SUCCESS) {
                            _Var42 = *k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int>;
                          }
                          k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int> = _Var42;
                          pDVar31 = DiagnosticStream::operator<<
                                              ((DiagnosticStream *)local_3d0,(char **)&k);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)pDVar31," builtin",8);
                          sVar22 = pDVar31->error_;
                          goto LAB_001b61ca;
                        }
                      }
                      else if (SVar13 == Input) {
                        local_3d0 = (undefined1  [8])&input_var_builtin;
                        pVar61 = std::
                                 _Hashtable<spv::BuiltIn,spv::BuiltIn,std::allocator<spv::BuiltIn>,std::__detail::_Identity,std::equal_to<spv::BuiltIn>,std::hash<spv::BuiltIn>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                                 ::
                                 _M_insert<spv::BuiltIn_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spv::BuiltIn,false>>>>
                                           ((_Hashtable<spv::BuiltIn,spv::BuiltIn,std::allocator<spv::BuiltIn>,std::__detail::_Identity,std::equal_to<spv::BuiltIn>,std::hash<spv::BuiltIn>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                                             *)local_3d0,&builtin,local_3d0);
                        if (((undefined1  [16])pVar61 & (undefined1  [16])0x1) ==
                            (undefined1  [16])0x0) {
                          ValidationState_t::diag
                                    ((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_ID,
                                     var_instr);
                          ValidationState_t::VkErrorID_abi_cxx11_
                                    (&linkage_name,vstate,0x25ba,(char *)0x0);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_3d0,linkage_name._M_dataplus._M_p,
                                     linkage_name._M_string_length);
                          lVar34 = 0x35;
                          pcVar52 = "OpEntryPoint contains duplicate input variables with ";
                          goto LAB_001b60d2;
                        }
                      }
                    }
                  }
                  p_Var39 = (_Base_ptr)std::_Rb_tree_increment(p_Var39);
                } while ((_Rb_tree_header *)p_Var39 != p_Var56);
                if (!bVar11) goto LAB_001b56e4;
                local_3d0._0_4_ = (MatrixLayout)local_550;
                pmVar38 = std::
                          map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
                          ::operator[](this,(key_type_conflict *)local_3d0);
                for (p_Var28 = (pmVar38->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
                    (_Rb_tree_header *)p_Var28 != &(pmVar38->_M_t)._M_impl.super__Rb_tree_header;
                    p_Var28 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var28)) {
                  bVar11 = spvIsVulkanEnv(vstate->context_->target_env);
                  if ((bVar11) && ((p_Var28[1]._M_color & ~_S_black) == 0x1e)) {
                    pIVar30 = ValidationState_t::FindDef(vstate,(uint32_t)local_550);
                    ValidationState_t::diag
                              ((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_ID,pIVar30);
                    pVVar43 = (ValidationState_t *)0x0;
                    ValidationState_t::VkErrorID_abi_cxx11_(&linkage_name,vstate,0x1333,(char *)0x0)
                    ;
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3d0,linkage_name._M_dataplus._M_p,
                               linkage_name._M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3d0,"A BuiltIn variable (id ",0x17);
                    std::ostream::_M_insert<unsigned_long>((ulong)local_3d0);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3d0,
                               ") cannot have any Location or Component decorations",0x33);
                    sVar22 = local_200;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)linkage_name._M_dataplus._M_p != &linkage_name.field_2) {
                      operator_delete(linkage_name._M_dataplus._M_p,
                                      CONCAT71(linkage_name.field_2._M_allocated_capacity._1_7_,
                                               linkage_name.field_2._M_local_buf[0]) + 1);
                    }
                    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3d0);
                    if (sVar22 != SPV_SUCCESS) goto LAB_001b663c;
                    break;
                  }
                }
                if (!bVar10) goto LAB_001b56e4;
                local_3d0._0_4_ = MVar17;
                pmVar38 = std::
                          map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
                          ::operator[](this,(key_type_conflict *)local_3d0);
                p_Var39 = (pmVar38->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
                p_Var56 = &(pmVar38->_M_t)._M_impl.super__Rb_tree_header;
                if ((_Rb_tree_header *)p_Var39 != p_Var56) {
                  while (p_Var39[1]._M_color != 2) {
                    p_Var39 = (_Base_ptr)std::_Rb_tree_increment(p_Var39);
                    if ((_Rb_tree_header *)p_Var39 == p_Var56) goto LAB_001b6164;
                  }
                }
                if ((_Rb_tree_header *)p_Var39 == p_Var56) {
LAB_001b6164:
                  pIVar27 = ValidationState_t::FindDef(vstate,MVar17);
                  ValidationState_t::diag
                            ((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_DATA,pIVar27);
                  ValidationState_t::VkErrorID_abi_cxx11_(&linkage_name,vstate,0x1337,(char *)0x0);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3d0,linkage_name._M_dataplus._M_p,
                             linkage_name._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3d0,
                             "Interface struct has no Block decoration but has BuiltIn members. Location decorations must be used on each member of OpVariable with a structure type that is a block not decorated with Location."
                             ,0xc3);
                  sVar22 = local_200;
LAB_001b61ca:
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)linkage_name._M_dataplus._M_p != &linkage_name.field_2) {
                    operator_delete(linkage_name._M_dataplus._M_p,
                                    CONCAT71(linkage_name.field_2._M_allocated_capacity._1_7_,
                                             linkage_name.field_2._M_local_buf[0]) + 1);
                  }
                  goto LAB_001b61f3;
                }
                uVar15 = (int)__h_1 + (uint)(SVar13 == Input);
                pVVar43 = (ValidationState_t *)(ulong)uVar15;
                iVar44 = (int)local_560 + (uint)(SVar13 == Output);
                __h_1 = (__hashtable *)CONCAT44(__h_1._4_4_,uVar15);
                if (((int)uVar15 < 2) && (iVar44 < 2)) goto LAB_001b56e8;
                local_560 = (_Rb_tree_node_base *)CONCAT44(local_560._4_4_,iVar44);
                break;
              }
LAB_001b56e4:
              iVar44 = (int)local_560;
LAB_001b56e8:
              local_560 = (_Rb_tree_node_base *)CONCAT44(local_560._4_4_,iVar44);
              if (SVar13 == StorageClassWorkgroup) {
                __h = (__hashtable *)(ulong)((uint)__h + 1);
                if (pIVar27 != (Instruction *)0x0) {
                  if ((pIVar27->inst_).opcode == 0x1e) {
                    bVar10 = anon_unknown_0::hasDecoration
                                       ((anon_unknown_0 *)(ulong)MVar17,2,decoration_00,pVVar43);
                    if (bVar10) {
                      local_4c4 = local_4c4 + 1;
                    }
                    else if ((uVar2 == 0x1142) &&
                            (bVar10 = EnumSet<spv::Capability>::contains(this_00,CapabilityShader),
                            bVar10)) {
                      ValidationState_t::diag
                                ((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_ID,var_instr
                                );
                      lVar34 = 0x3e;
                      pcVar52 = "Untyped workgroup variables in shaders must be block decorated";
                      goto LAB_001b658a;
                    }
                    bVar10 = anon_unknown_0::hasDecoration
                                       ((anon_unknown_0 *)(ulong)(var_instr->inst_).result_id,0x14,
                                        decoration_00,pVVar43);
                    local_4a8 = (map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
                                 *)CONCAT44(local_4a8._4_4_,(uint)local_4a8 + bVar10);
                  }
                  else if ((uVar2 == 0x1142) &&
                          (bVar10 = EnumSet<spv::Capability>::contains(this_00,CapabilityShader),
                          bVar10)) {
                    ValidationState_t::diag
                              ((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_ID,var_instr);
                    lVar34 = 0x46;
                    pcVar52 = 
                    "Untyped workgroup variables in shaders must be block decorated structs";
LAB_001b658a:
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3d0,pcVar52,lVar34);
                    sVar22 = local_200;
                    goto LAB_001b6632;
                  }
                }
              }
              bVar10 = spvIsVulkanEnv(vstate->context_->target_env);
              if (bVar10) {
                psVar26 = ValidationState_t::GetExecutionModels(vstate,(uint32_t)local_558);
                p_Var7 = (__hashtable *)
                         (psVar26->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
                __h_3 = (__hashtable *)&(psVar26->_M_t)._M_impl.super__Rb_tree_header;
                local_410 = CONCAT44(local_410._4_4_,MVar17);
                p_Var41 = __h_3;
                p_Var45 = p_Var7;
                p_Var49 = __h_3;
                if (p_Var7 == (__hashtable *)0x0) {
                  __h_2._0_4_ = 0;
                }
                else {
                  do {
                    bVar10 = (uint)(p_Var45->_M_rehash_policy)._M_max_load_factor < 4;
                    if (!bVar10) {
                      p_Var41 = p_Var45;
                    }
                    p_Var45 = (__hashtable *)(&p_Var45->_M_before_begin)[bVar10]._M_nxt;
                  } while (p_Var45 != (__hashtable *)0x0);
                  p_Var45 = __h_3;
                  if ((p_Var41 != __h_3) &&
                     (p_Var45 = p_Var41, 4 < (uint)(p_Var41->_M_rehash_policy)._M_max_load_factor))
                  {
                    p_Var41 = __h_3;
                    p_Var45 = __h_3;
                  }
                  do {
                    p_Var53 = p_Var7;
                    p_Var7 = (__hashtable *)(p_Var53->_M_before_begin)._M_nxt;
                  } while (p_Var7 != (__hashtable *)0x0);
                  pVVar43 = (ValidationState_t *)
                            CONCAT71((int7)((ulong)p_Var41 >> 8),p_Var45 != __h_3);
                  __h_2._0_4_ = SUB84(pVVar43,0);
                  if ((p_Var53 != __h_3) &&
                     (p_Var49 = p_Var53, (p_Var53->_M_rehash_policy)._M_max_load_factor != 0.0)) {
                    p_Var49 = __h_3;
                  }
                }
                local_3d0._0_4_ = (var_instr->inst_).result_id;
                pmVar38 = std::
                          map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
                          ::operator[](this,(key_type_conflict *)local_3d0);
                p_Var28 = (pmVar38->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
                for (; (_Rb_tree_header *)p_Var28 != &(pmVar38->_M_t)._M_impl.super__Rb_tree_header;
                    p_Var28 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var28)) {
                  local_3f8._M_unused._M_object = (void *)0x0;
                  local_3f8._8_8_ = 0;
                  local_3e8 = (code *)0x0;
                  local_3d0._0_4_ = 0xe;
                  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_3c8,
                             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_3f8);
                  puVar47 = (pointer)local_3c8._0_8_;
                  local_3b0 = 0xffffffff;
                  if (p_Var28[1]._M_color == local_3d0._0_4_) {
                    p_Var39 = p_Var28[1]._M_parent;
                    pVVar46 = (ValidationState_t *)((long)p_Var28[1]._M_left - (long)p_Var39);
                    pVVar43 = (ValidationState_t *)(local_3c8._8_8_ - local_3c8._0_8_);
                    if ((pVVar46 != pVVar43) ||
                       (((p_Var28[1]._M_left != p_Var39 &&
                         (iVar44 = bcmp(p_Var39,(void *)local_3c8._0_8_,(size_t)pVVar46),
                         iVar44 != 0)) || (p_Var28[2]._M_color != ~_S_red)))) goto LAB_001b5905;
                    bVar10 = true;
                  }
                  else {
LAB_001b5905:
                    _ep_id = (pointer)0x0;
                    puStack_420 = (pointer)0x0;
                    local_418 = (pointer)0x0;
                    linkage_name._M_dataplus._M_p._0_4_ = 0xd;
                    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                               &linkage_name._M_string_length,
                               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&ep_id);
                    pvVar48 = (void *)linkage_name._M_string_length;
                    if (p_Var28[1]._M_color == (_Rb_tree_color)linkage_name._M_dataplus._M_p) {
                      p_Var39 = p_Var28[1]._M_parent;
                      pVVar46 = (ValidationState_t *)((long)p_Var28[1]._M_left - (long)p_Var39);
                      pVVar43 = (ValidationState_t *)
                                (CONCAT71(linkage_name.field_2._M_allocated_capacity._1_7_,
                                          linkage_name.field_2._M_local_buf[0]) -
                                linkage_name._M_string_length);
                      if (((pVVar46 != pVVar43) ||
                          ((p_Var28[1]._M_left != p_Var39 &&
                           (iVar44 = bcmp(p_Var39,(void *)linkage_name._M_string_length,
                                          (size_t)pVVar46), iVar44 != 0)))) ||
                         (p_Var28[2]._M_color != ~_S_red)) goto LAB_001b5984;
                      bVar10 = true;
                    }
                    else {
LAB_001b5984:
                      local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                      local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                      local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                      k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int>.
                      super__Tuple_impl<1UL,_unsigned_int>.
                      super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                           (_Head_base<1UL,_unsigned_int,_false>)0x11;
                      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_4f0,
                                 &local_1c8);
                      puVar47 = (pointer)auStack_4f0._0_8_;
                      local_4d8 = 0xffffffff;
                      if ((_Head_base<1UL,_unsigned_int,_false>)p_Var28[1]._M_color ==
                          k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int>.
                          super__Tuple_impl<1UL,_unsigned_int>.
                          super__Head_base<1UL,_unsigned_int,_false>._M_head_impl) {
                        p_Var39 = p_Var28[1]._M_parent;
                        pVVar46 = (ValidationState_t *)((long)p_Var28[1]._M_left - (long)p_Var39);
                        pVVar43 = (ValidationState_t *)(auStack_4f0._8_8_ - auStack_4f0._0_8_);
                        if (((pVVar46 != pVVar43) ||
                            ((p_Var28[1]._M_left != p_Var39 &&
                             (iVar44 = bcmp(p_Var39,(void *)auStack_4f0._0_8_,(size_t)pVVar46),
                             iVar44 != 0)))) || (p_Var28[2]._M_color != ~_S_red)) goto LAB_001b5a15;
                        bVar10 = true;
                      }
                      else {
LAB_001b5a15:
                        local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                        local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                        local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                        builtin = 0x10;
                        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                                  (&vStack_450,&local_1e8);
                        puVar47 = vStack_450.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start;
                        local_438 = 0xffffffff;
                        if (p_Var28[1]._M_color == builtin) {
                          p_Var39 = p_Var28[1]._M_parent;
                          pVVar46 = (ValidationState_t *)((long)p_Var28[1]._M_left - (long)p_Var39);
                          pVVar43 = (ValidationState_t *)
                                    ((long)vStack_450.
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_finish +
                                    -(long)vStack_450.
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_start);
                          if ((pVVar46 != pVVar43) ||
                             ((p_Var28[1]._M_left != p_Var39 &&
                              (iVar44 = bcmp(p_Var39,vStack_450.
                                                                                                          
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                             (size_t)pVVar46), iVar44 != 0)))) goto LAB_001b5aa3;
                          bVar10 = p_Var28[2]._M_color == ~_S_red;
                        }
                        else {
LAB_001b5aa3:
                          bVar10 = false;
                        }
                        if (puVar47 != (pointer)0x0) {
                          operator_delete(puVar47,(long)vStack_450.
                                                                                                                
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)puVar47);
                        }
                        puVar47 = (pointer)auStack_4f0._0_8_;
                        if (local_1e8.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start != (pointer)0x0) {
                          operator_delete(local_1e8.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_start,
                                          (long)local_1e8.
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                          (long)local_1e8.
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                ._M_impl.super__Vector_impl_data._M_start);
                          puVar47 = (pointer)auStack_4f0._0_8_;
                        }
                      }
                      if (puVar47 != (pointer)0x0) {
                        operator_delete(puVar47,(long)local_4e0 - (long)puVar47);
                      }
                      pvVar48 = (void *)linkage_name._M_string_length;
                      if (local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                        operator_delete(local_1c8.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                                        (long)local_1c8.
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                        (long)local_1c8.
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
                        pvVar48 = (void *)linkage_name._M_string_length;
                      }
                    }
                    if (pvVar48 != (void *)0x0) {
                      operator_delete(pvVar48,linkage_name.field_2._8_8_ - (long)pvVar48);
                    }
                    puVar47 = (pointer)local_3c8._0_8_;
                    if (_ep_id != (pointer)0x0) {
                      operator_delete(_ep_id,(long)local_418 - (long)_ep_id);
                      puVar47 = (pointer)local_3c8._0_8_;
                    }
                  }
                  if (puVar47 != (pointer)0x0) {
                    operator_delete(puVar47,local_3c8._16_8_ - (long)puVar47);
                  }
                  if (local_3f8._M_unused._M_object != (void *)0x0) {
                    operator_delete(local_3f8._M_unused._M_object,(long)local_3e8 - local_3f8._0_8_)
                    ;
                  }
                  if (bVar10) {
                    if (SVar13 == Output) {
                      pVVar43 = (ValidationState_t *)
                                (ulong)CONCAT31((int3)((uint)__h_2._0_4_ >> 8),~(byte)__h_2);
                      if ((~(byte)__h_2 &
                          (psVar26->_M_t)._M_impl.super__Rb_tree_header._M_node_count < 2) == 0) {
                        ValidationState_t::diag
                                  ((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_ID,
                                   var_instr);
                        ValidationState_t::VkErrorID_abi_cxx11_
                                  (&linkage_name,vstate,0x1839,(char *)0x0);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_3d0,linkage_name._M_dataplus._M_p,
                                   linkage_name._M_string_length);
                        ValidationState_t::SpvDecorationString_abi_cxx11_
                                  ((string *)&k,vstate,p_Var28[1]._M_color);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_3d0,
                                   (char *)k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int>,
                                   auStack_4f0._0_8_);
                        lVar34 = 0x6f;
                        pcVar52 = 
                        " decorated variable must not be used in fragment execution model as an Output storage class for Entry Point id "
                        ;
                        goto LAB_001b6464;
                      }
                    }
                    else if ((SVar13 == Input) &&
                            ((p_Var49 != __h_3 ||
                             (1 < (psVar26->_M_t)._M_impl.super__Rb_tree_header._M_node_count)))) {
                      ValidationState_t::diag
                                ((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_ID,var_instr
                                );
                      ValidationState_t::VkErrorID_abi_cxx11_
                                (&linkage_name,vstate,0x183a,(char *)0x0);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3d0,linkage_name._M_dataplus._M_p,
                                 linkage_name._M_string_length);
                      ValidationState_t::SpvDecorationString_abi_cxx11_
                                ((string *)&k,vstate,p_Var28[1]._M_color);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3d0,
                                 (char *)k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int>,
                                 auStack_4f0._0_8_);
                      lVar34 = 0x6c;
                      pcVar52 = 
                      " decorated variable must not be used in vertex execution model as an Input storage class for Entry Point id "
                      ;
LAB_001b6464:
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3d0,pcVar52,lVar34);
                      std::ostream::_M_insert<unsigned_long>((ulong)local_3d0);
                      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3d0,".",1)
                      ;
                      local_5a8 = (Instruction *)(ulong)(uint)local_200;
                      if (k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int> !=
                          (_Tuple_impl<0UL,_spv::Decoration,_unsigned_int>)((long)auStack_4f0 + 8))
                      {
                        operator_delete((void *)k.
                                                super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int>
                                        ,(ulong)(auStack_4f0._8_8_ + 1));
                      }
                      goto LAB_001b64bb;
                    }
                  }
                }
                bVar10 = anon_unknown_0::hasDecoration
                                   ((anon_unknown_0 *)(ulong)(var_instr->inst_).result_id,0xe,
                                    decoration_00,pVVar43);
                uVar18 = (uint32_t)local_410;
                if (((!bVar10) && ((SVar13 == Input & (byte)__h_2) != 0)) &&
                   (((bVar10 = ValidationState_t::IsFloatScalarType(vstate,(uint32_t)local_410),
                     bVar10 && (uVar16 = ValidationState_t::GetBitWidth(vstate,uVar18),
                               uVar16 == 0x40)) ||
                    (bVar10 = ValidationState_t::IsIntScalarOrVectorType(vstate,uVar18), bVar10))))
                {
                  ValidationState_t::diag
                            ((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_ID,var_instr);
                  ValidationState_t::VkErrorID_abi_cxx11_(&linkage_name,vstate,0x1288,(char *)0x0);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3d0,linkage_name._M_dataplus._M_p,
                             linkage_name._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3d0,"Fragment OpEntryPoint operand ",0x1e);
                  std::ostream::_M_insert<unsigned_long>((ulong)local_3d0);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3d0,
                             " with Input interfaces with integer or float type must have a Flat decoration for Entry Point id "
                             ,0x61);
                  std::ostream::_M_insert<unsigned_long>((ulong)local_3d0);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3d0,".",1);
                  local_5a8 = (Instruction *)(ulong)(uint)local_200;
LAB_001b64bb:
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)linkage_name._M_dataplus._M_p != &linkage_name.field_2) {
                    operator_delete(linkage_name._M_dataplus._M_p,
                                    CONCAT71(linkage_name.field_2._M_allocated_capacity._1_7_,
                                             linkage_name.field_2._M_local_buf[0]) + 1);
                  }
                  goto LAB_001b64e4;
                }
              }
              pIVar25 = (pointer)((long)&(local_498->words_).
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start + 4);
            } while (pIVar25 != local_4b8);
          }
          if (((int)__h_1 < 2) && ((int)local_560 < 2)) {
            local_3d0._0_4_ = (MatrixLayout)local_558;
            pmVar38 = std::
                      map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
                      ::operator[](this,(key_type_conflict *)local_3d0);
            for (p_Var39 = (pmVar38->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
                (_Rb_tree_header *)p_Var39 != &(pmVar38->_M_t)._M_impl.super__Rb_tree_header;
                p_Var39 = (_Base_ptr)std::_Rb_tree_increment(p_Var39)) {
              if (p_Var39[1]._M_color == 0x29) {
                p_Var55 = p_Var39[1]._M_parent;
                p_Var39 = p_Var39[1]._M_left;
                linkage_name._M_dataplus._M_p = (pointer)&linkage_name.field_2;
                linkage_name._M_string_length = 0;
                linkage_name.field_2._M_local_buf[0] = '\0';
                do {
                  if (p_Var55 == p_Var39) {
                    __assert_fail("!assert_found_terminating_null && \"Did not find terminating null for the string.\""
                                  ,
                                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/util/string_utils.h"
                                  ,0x65,
                                  "std::string spvtools::utils::MakeString(InputIt, InputIt, bool) [InputIt = __gnu_cxx::__normal_iterator<const unsigned int *, std::vector<unsigned int>>]"
                                 );
                  }
                  _Var6 = p_Var55->_M_color;
                  lVar34 = 0;
                  do {
                    if ((char)(_Var6 >> ((byte)lVar34 & 0x1f)) == '\0') {
                      pIVar27 = ValidationState_t::FindDef(vstate,(uint32_t)local_558);
                      ValidationState_t::diag
                                ((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_BINARY,
                                 pIVar27);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3d0,
                                 "The LinkageAttributes Decoration (Linkage name: ",0x30);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3d0,linkage_name._M_dataplus._M_p,
                                 linkage_name._M_string_length);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3d0,") cannot be applied to function id ",0x23);
                      std::ostream::_M_insert<unsigned_long>((ulong)local_3d0);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3d0,
                                 " because it is targeted by an OpEntryPoint instruction.",0x37);
                      local_5a8 = (Instruction *)(ulong)(uint)local_200;
                      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3d0);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)linkage_name._M_dataplus._M_p != &linkage_name.field_2) {
                        operator_delete(linkage_name._M_dataplus._M_p,
                                        CONCAT71(linkage_name.field_2._M_allocated_capacity._1_7_,
                                                 linkage_name.field_2._M_local_buf[0]) + 1);
                      }
                      goto LAB_001b64e9;
                    }
                    std::__cxx11::string::push_back((char)&linkage_name);
                    lVar34 = lVar34 + 8;
                  } while (lVar34 != 0x20);
                  p_Var55 = (_Base_ptr)&p_Var55->field_0x4;
                } while( true );
              }
            }
            bVar10 = EnumSet<spv::Capability>::contains
                               (this_00,CapabilityWorkgroupMemoryExplicitLayoutKHR);
            if (bVar10) {
              bVar11 = EnumSet<spv::Capability>::contains(this_00,CapabilityUntypedPointersKHR);
              uVar15 = local_4c4;
              bVar10 = true;
              if (((!bVar11) && (0 < (int)(uint)__h)) && (0 < (int)local_4c4)) {
                if ((uint)__h != local_4c4) {
                  pIVar27 = ValidationState_t::FindDef(vstate,(uint32_t)local_558);
                  ValidationState_t::diag
                            ((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_BINARY,pIVar27);
                  lVar34 = 0x102;
                  pcVar52 = 
                  "When declaring WorkgroupMemoryExplicitLayoutKHR, either all or none of the Workgroup Storage Class variables in the entry point interface must point to struct types decorated with Block (unless the UntypedPointersKHR capability is declared).  Entry point id "
                  ;
                  goto LAB_001b5e8b;
                }
                if ((1 < local_4c4) && (local_4c4 != (uint)local_4a8)) {
                  pIVar27 = ValidationState_t::FindDef(vstate,(uint32_t)local_558);
                  ValidationState_t::diag
                            ((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_BINARY,pIVar27);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3d0,
                             "When declaring WorkgroupMemoryExplicitLayoutKHR, if more than one Workgroup Storage Class variable in the entry point interface point to a type decorated with Block, all of them must be decorated with Aliased (unless the UntypedPointerWorkgroupKHR capability is declared). Entry point id "
                             ,0x120);
                  std::ostream::_M_insert<unsigned_long>((ulong)local_3d0);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3d0," does not meet this requirement.",0x20);
                  local_5a8 = (Instruction *)(ulong)(uint)local_200;
                  DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3d0);
                  bVar10 = false;
                }
                __h = (__hashtable *)(ulong)uVar15;
              }
            }
            else {
              if (0 < (int)local_4c4) {
                pIVar27 = ValidationState_t::FindDef(vstate,(uint32_t)local_558);
                ValidationState_t::diag
                          ((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_BINARY,pIVar27);
                lVar34 = 0x81;
                pcVar52 = 
                "Workgroup Storage Class variables can\'t be decorated with Block unless declaring the WorkgroupMemoryExplicitLayoutKHR capability."
                ;
                goto LAB_001b5eaa;
              }
              bVar10 = true;
            }
          }
          else {
            pIVar27 = ValidationState_t::FindDef(vstate,(MatrixLayout)local_558);
            ValidationState_t::diag
                      ((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_BINARY,pIVar27);
            lVar34 = 0xa9;
            pcVar52 = 
            "There must be at most one object per Storage Class that can contain a structure type containing members decorated with BuiltIn, consumed per entry-point. Entry Point id "
            ;
LAB_001b5e8b:
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3d0,pcVar52,lVar34);
            std::ostream::_M_insert<unsigned_long>((ulong)local_3d0);
            lVar34 = 0x20;
            pcVar52 = " does not meet this requirement.";
LAB_001b5eaa:
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3d0,pcVar52,lVar34);
            local_5a8 = (Instruction *)(ulong)(uint)local_200;
LAB_001b64e4:
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3d0);
LAB_001b64e9:
            bVar10 = false;
          }
LAB_001b6645:
          std::
          _Hashtable<spv::BuiltIn,_spv::BuiltIn,_std::allocator<spv::BuiltIn>,_std::__detail::_Identity,_std::equal_to<spv::BuiltIn>,_std::hash<spv::BuiltIn>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable(&output_var_builtin._M_h);
          std::
          _Hashtable<spv::BuiltIn,_spv::BuiltIn,_std::allocator<spv::BuiltIn>,_std::__detail::_Identity,_std::equal_to<spv::BuiltIn>,_std::hash<spv::BuiltIn>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable(&input_var_builtin._M_h);
          std::
          _Hashtable<spvtools::val::Instruction_*,_spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::val::Instruction_*>,_std::hash<spvtools::val::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable(&seen_vars._M_h);
          if (!bVar10) {
            if ((spv_result_t)local_5a8 != SPV_SUCCESS) {
              return (spv_result_t)local_5a8;
            }
            goto LAB_001b680f;
          }
          pIVar27 = (Instruction *)&(local_4a0->inst_).num_words;
        } while (pIVar27 != local_4c0);
      }
      puVar23 = local_1f0 + 1;
    } while (puVar23 != local_1f8);
  }
LAB_001b680f:
  seen_vars._M_h._M_buckets = &seen_vars._M_h._M_single_bucket;
  seen_vars._M_h._M_bucket_count = 1;
  seen_vars._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  seen_vars._M_h._M_element_count = 0;
  seen_vars._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  seen_vars._M_h._M_rehash_policy._M_next_resize = 0;
  seen_vars._M_h._M_single_bucket = (__node_base_ptr)0x0;
  pIVar25 = (vstate->ordered_instructions_).
            super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pIVar50 = (vstate->ordered_instructions_).
            super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (pIVar25 != pIVar50) {
    local_4a0 = (Instruction *)&vstate->module_capabilities_;
    local_4a8 = &vstate->id_decorations_;
    __h_1 = &(vstate->struct_for_uniform_block_)._M_h;
    local_5a8 = (Instruction *)&vstate->struct_for_storage_buffer_;
    local_4b8 = pIVar50;
    __h_3 = (__hashtable *)local_5a8;
    do {
      pIVar27 = ValidationState_t::FindDef(vstate,(pIVar25->inst_).type_id);
      input_var_builtin._M_h._M_buckets = &input_var_builtin._M_h._M_single_bucket;
      input_var_builtin._M_h._M_bucket_count = 1;
      input_var_builtin._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      input_var_builtin._M_h._M_element_count = 0;
      input_var_builtin._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      input_var_builtin._M_h._M_rehash_policy._M_next_resize = 0;
      input_var_builtin._M_h._M_single_bucket = (__node_base_ptr)0x0;
      uVar3 = (pIVar25->inst_).opcode;
      if ((uVar3 != 0x1142) && (uVar3 != 0x3b)) {
        if ((pIVar27 == (Instruction *)0x0) ||
           (((pIVar27->inst_).opcode != 0x20 ||
            (SVar13 = Instruction::GetOperandAs<spv::StorageClass>(pIVar27,1),
            SVar13 != PhysicalStorageBuffer)))) {
          bVar10 = EnumSet<spv::Capability>::contains
                             ((EnumSet<spv::Capability> *)local_4a0,CapabilityUntypedPointersKHR);
          _Var9 = input_var_builtin._M_h._M_before_begin;
          cVar57 = '\0';
          if ((bVar10) &&
             (bVar10 = spvIsVulkanEnv(vstate->context_->target_env),
             _Var9 = input_var_builtin._M_h._M_before_begin, cVar57 = '\0', bVar10)) {
            uVar2 = (pIVar25->inst_).opcode;
            cVar57 = '\x03';
            uVar15 = uVar2 - 0x1143;
            if (uVar15 < 7) {
              if ((0x33U >> (uVar15 & 0x1f) & 1) == 0) {
                if (uVar15 != 6) goto LAB_001b77e4;
                uVar15 = Instruction::GetOperandAs<unsigned_int>(pIVar25,3);
                pIVar27 = ValidationState_t::FindDef(vstate,uVar15);
                uVar18 = (pIVar27->inst_).type_id;
              }
              else {
                uVar18 = (pIVar25->inst_).type_id;
              }
              uVar16 = Instruction::GetOperandAs<unsigned_int>(pIVar25,2);
LAB_001b6adc:
              _Var9._M_nxt = input_var_builtin._M_h._M_before_begin._M_nxt;
              cVar57 = '\x03';
              if ((uVar16 != 0) && (uVar18 != 0)) {
                local_4c0 = pIVar25;
                pIVar27 = ValidationState_t::FindDef(vstate,uVar18);
                SVar13 = Instruction::GetOperandAs<spv::StorageClass>(pIVar27,1);
                pcVar52 = "Uniform";
                if ((SVar13 == StorageClassUniform) ||
                   (pcVar52 = "PushConstant", SVar13 == PushConstant)) {
                  pIVar27 = ValidationState_t::FindDef(vstate,uVar16);
                  scalar_block_layout = vstate->options_->scalar_block_layout;
                  if ((pIVar27->inst_).opcode == 0x1e) {
                    if (SVar13 == StorageClassUniform) {
                      bVar10 = ValidationState_t::HasDecoration(vstate,uVar16,BufferBlock);
                    }
                    else {
                      bVar10 = true;
                    }
                    goto LAB_001b7d3d;
                  }
                  bVar11 = true;
                  decoration_str = "Block";
                  pcVar32 = "Block";
                  if (SVar13 != StorageClassUniform) goto LAB_001b7d82;
                }
                else {
                  pIVar27 = ValidationState_t::FindDef(vstate,uVar16);
                  if (SVar13 == StorageClassWorkgroup) {
                    scalar_block_layout = vstate->options_->workgroup_scalar_block_layout;
                    pcVar52 = "Function or Workgroup";
                  }
                  else {
                    scalar_block_layout = vstate->options_->scalar_block_layout;
                    pcVar52 = "ConstantDataStorageBuffer";
                  }
                  pcVar52 = pcVar52 + 0xc;
                  bVar10 = true;
                  pcVar32 = "Block";
                  if ((pIVar27->inst_).opcode == 0x1e) {
LAB_001b7d3d:
                    local_3d0._0_4_ = kColumnMajor;
                    local_3d0._4_4_ = 0;
                    anon_unknown_0::ComputeMemberConstraintsForStruct
                              ((MemberConstraints *)&input_var_builtin,uVar16,
                               (LayoutConstraints *)local_3d0,vstate);
                    pcVar32 = "Block";
                    if (SVar13 == StorageClassUniform) {
                      pcVar32 = "BufferBlock";
                    }
                    bVar11 = true;
                    decoration_str = "Block";
                    if (bVar10 == false) goto LAB_001b7d87;
                  }
LAB_001b7d82:
                  bVar11 = false;
                  decoration_str = pcVar32;
                }
LAB_001b7d87:
                sVar22 = anon_unknown_0::checkLayout
                                   (uVar16,pcVar52,decoration_str,bVar11,(bool)scalar_block_layout,0
                                    ,(MemberConstraints *)&input_var_builtin,vstate);
                cVar57 = sVar22 != SPV_SUCCESS;
                local_5a8 = (Instruction *)((ulong)local_5a8 & 0xffffffff);
                _Var9 = input_var_builtin._M_h._M_before_begin;
                pIVar25 = local_4c0;
                pIVar50 = local_4b8;
                if ((bool)cVar57) {
                  local_5a8 = (Instruction *)(ulong)(uint)sVar22;
                }
              }
            }
            else {
LAB_001b77e4:
              if (uVar2 == 0x3d) {
                uVar18 = ValidationState_t::GetOperandTypeId(vstate,pIVar25,2);
                OVar19 = ValidationState_t::GetIdOpcode(vstate,uVar18);
                _Var9 = input_var_builtin._M_h._M_before_begin;
                if (OVar19 == OpTypeUntypedPointerKHR) {
                  uVar15 = Instruction::GetOperandAs<unsigned_int>(pIVar25,2);
                  pIVar27 = ValidationState_t::FindDef(vstate,uVar15);
                  uVar18 = (pIVar27->inst_).type_id;
                  uVar16 = (pIVar25->inst_).type_id;
                  goto LAB_001b6adc;
                }
              }
              else if (uVar2 == 0x3e) {
                uVar18 = ValidationState_t::GetOperandTypeId(vstate,pIVar25,0);
                OVar19 = ValidationState_t::GetIdOpcode(vstate,uVar18);
                _Var9 = input_var_builtin._M_h._M_before_begin;
                if (OVar19 == OpTypeUntypedPointerKHR) {
                  uVar15 = Instruction::GetOperandAs<unsigned_int>(pIVar25,0);
                  pIVar27 = ValidationState_t::FindDef(vstate,uVar15);
                  uVar18 = (pIVar27->inst_).type_id;
                  uVar16 = ValidationState_t::GetOperandTypeId(vstate,pIVar25,1);
                  goto LAB_001b6adc;
                }
              }
            }
          }
        }
        else {
          uVar15 = Instruction::GetOperandAs<unsigned_int>(pIVar27,2);
          pIVar27 = ValidationState_t::FindDef(vstate,uVar15);
          bVar10 = vstate->options_->scalar_block_layout;
          if ((pIVar27->inst_).opcode == 0x1e) {
            local_3d0._0_4_ = kColumnMajor;
            local_3d0._4_4_ = 0;
            anon_unknown_0::ComputeMemberConstraintsForStruct
                      ((MemberConstraints *)&input_var_builtin,uVar15,(LayoutConstraints *)local_3d0
                       ,vstate);
          }
          sVar22 = anon_unknown_0::checkLayout
                             (uVar15,"PhysicalStorageBuffer","Block",false,bVar10,0,
                              (MemberConstraints *)&input_var_builtin,vstate);
          cVar57 = sVar22 != SPV_SUCCESS;
          local_5a8 = (Instruction *)((ulong)local_5a8 & 0xffffffff);
          _Var9 = input_var_builtin._M_h._M_before_begin;
          if ((bool)cVar57) {
            local_5a8 = (Instruction *)(ulong)(uint)sVar22;
          }
        }
        goto joined_r0x001b7c1a;
      }
      uVar15 = (pIVar25->inst_).result_id;
      uVar54 = (pIVar25->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start[3];
      pVVar43 = (ValidationState_t *)(ulong)uVar54;
      bVar10 = spvIsVulkanEnv(vstate->context_->target_env);
      if (bVar10) {
        if (uVar54 == 9) {
          ValidationState_t::EntryPointReferences
                    ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                     &output_var_builtin,vstate,uVar15);
          for (p_Var28 = (_Rb_tree_node_base *)output_var_builtin._M_h._M_element_count;
              p_Var28 != (_Rb_tree_node_base *)&output_var_builtin._M_h._M_bucket_count;
              p_Var28 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var28)) {
            _ep_id = (pointer)CONCAT44(uStack_424,p_Var28[1]._M_color);
            local_3d0 = (undefined1  [8])&seen_vars;
            pVar62 = std::
                     _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                     ::
                     _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                               ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                                 *)local_3d0,&ep_id,local_3d0);
            if (((undefined1  [16])pVar62 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
              pIVar27 = ValidationState_t::FindDef(vstate,uVar15);
              ValidationState_t::diag
                        ((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_ID,pIVar27);
              ValidationState_t::VkErrorID_abi_cxx11_(&linkage_name,vstate,0x1a12,(char *)0x0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_3d0,linkage_name._M_dataplus._M_p,
                         linkage_name._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_3d0,"Entry point id \'",0x10);
              std::ostream::_M_insert<unsigned_long>((ulong)local_3d0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_3d0,"\' uses more than one PushConstant interface.\n",0x2d
                        );
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_3d0,"From Vulkan spec:\n",0x12);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_3d0,"There must be no more than one push constant block ",
                         0x33);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_3d0,"statically used per shader entry point.",0x27);
              local_5a8 = (Instruction *)(ulong)(uint)local_200;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)linkage_name._M_dataplus._M_p != &linkage_name.field_2) goto LAB_001b74ca;
              goto LAB_001b74d7;
            }
          }
          std::
          _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
          ::_M_erase((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                      *)&output_var_builtin,
                     (_Link_type)output_var_builtin._M_h._M_before_begin._M_nxt);
        }
        if (uVar54 != 0) goto LAB_001b6bec;
        ValidationState_t::EntryPointReferences
                  ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                   &output_var_builtin,vstate,uVar15);
        if (output_var_builtin._M_h._M_rehash_policy._M_next_resize == 0) {
LAB_001b6bda:
          std::
          _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
          ::_M_erase((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                      *)&output_var_builtin,
                     (_Link_type)output_var_builtin._M_h._M_before_begin._M_nxt);
          goto LAB_001b6bec;
        }
        bVar10 = anon_unknown_0::hasDecoration
                           ((anon_unknown_0 *)(ulong)uVar15,0x22,decoration_00,pVVar43);
        if (bVar10) {
          if ((output_var_builtin._M_h._M_rehash_policy._M_next_resize == 0) ||
             (bVar10 = anon_unknown_0::hasDecoration
                                 ((anon_unknown_0 *)(ulong)uVar15,0x21,decoration_00,pVVar43),
             bVar10)) goto LAB_001b6bda;
          pIVar27 = ValidationState_t::FindDef(vstate,uVar15);
          ValidationState_t::diag((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_ID,pIVar27)
          ;
          ValidationState_t::VkErrorID_abi_cxx11_(&linkage_name,vstate,0x1a15,(char *)0x0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_3d0,linkage_name._M_dataplus._M_p,
                     linkage_name._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_3d0,"UniformConstant id \'",0x14);
          std::ostream::_M_insert<unsigned_long>((ulong)local_3d0);
          lVar34 = 0x21;
          pcVar52 = "\' is missing Binding decoration.\n";
        }
        else {
          pIVar27 = ValidationState_t::FindDef(vstate,uVar15);
          ValidationState_t::diag((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_ID,pIVar27)
          ;
          ValidationState_t::VkErrorID_abi_cxx11_(&linkage_name,vstate,0x1a15,(char *)0x0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_3d0,linkage_name._M_dataplus._M_p,
                     linkage_name._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_3d0,"UniformConstant id \'",0x14);
          std::ostream::_M_insert<unsigned_long>((ulong)local_3d0);
          lVar34 = 0x27;
          pcVar52 = "\' is missing DescriptorSet decoration.\n";
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3d0,pcVar52,lVar34);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_3d0,"From Vulkan spec:\n",0x12);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_3d0,
                   "These variables must have DescriptorSet and Binding decorations specified",0x49)
        ;
        local_5a8 = (Instruction *)(ulong)(uint)local_200;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)linkage_name._M_dataplus._M_p != &linkage_name.field_2) {
LAB_001b74ca:
          operator_delete(linkage_name._M_dataplus._M_p,
                          CONCAT71(linkage_name.field_2._M_allocated_capacity._1_7_,
                                   linkage_name.field_2._M_local_buf[0]) + 1);
        }
LAB_001b74d7:
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3d0);
LAB_001b74e4:
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::_M_erase((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                    *)&output_var_builtin,(_Link_type)output_var_builtin._M_h._M_before_begin._M_nxt
                  );
LAB_001b7c09:
        _Var9._M_nxt = input_var_builtin._M_h._M_before_begin._M_nxt;
        cVar57 = '\x01';
      }
      else {
LAB_001b6bec:
        local_560 = (_Rb_tree_node_base *)(ulong)uVar15;
        bVar10 = spvIsOpenGLEnv(vstate->context_->target_env);
        p_Var28 = local_560;
        local_550 = CONCAT44(local_550._4_4_,uVar54);
        if (bVar10) {
          bVar58 = uVar54 != 0xc;
          bVar59 = uVar54 != 2;
          bVar10 = anon_unknown_0::hasDecoration
                             ((anon_unknown_0 *)((ulong)local_560 & 0xffffffff),2,decoration_00,
                              pVVar43);
          uVar54 = (uint)local_550;
          bVar11 = anon_unknown_0::hasDecoration
                             ((anon_unknown_0 *)((ulong)p_Var28 & 0xffffffff),3,decoration_00,
                              pVVar43);
          pIVar50 = local_4b8;
          p_Var28 = local_560;
          if ((bVar58 || !bVar10) && (bVar59 || !bVar10 && !bVar11)) goto LAB_001b6cc4;
          uVar18 = (uint32_t)local_560;
          ValidationState_t::EntryPointReferences
                    ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                     &output_var_builtin,vstate,uVar18);
          if ((output_var_builtin._M_h._M_rehash_policy._M_next_resize == 0) ||
             (bVar10 = anon_unknown_0::hasDecoration
                                 ((anon_unknown_0 *)((ulong)p_Var28 & 0xffffffff),0x21,decoration_00
                                  ,pVVar43), bVar10)) {
            std::
            _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
            ::_M_erase((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                        *)&output_var_builtin,
                       (_Link_type)output_var_builtin._M_h._M_before_begin._M_nxt);
            goto LAB_001b6cc4;
          }
          pIVar27 = ValidationState_t::FindDef(vstate,uVar18);
          ValidationState_t::diag((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_ID,pIVar27)
          ;
          pcVar52 = "Storage Buffer";
          if (uVar54 == 2) {
            pcVar52 = "Uniform";
          }
          linkage_name._M_dataplus._M_p = pcVar52;
          pDVar31 = DiagnosticStream::operator<<
                              ((DiagnosticStream *)local_3d0,(char **)&linkage_name);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar31," id \'",5);
          std::ostream::_M_insert<unsigned_long>((ulong)pDVar31);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pDVar31,"\' is missing Binding decoration.\n",0x21);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pDVar31,"From ARB_gl_spirv extension:\n",0x1d);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pDVar31,"Uniform and shader storage block variables must ",0x30);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pDVar31,"also be decorated with a *Binding*.",0x23);
          local_5a8 = (Instruction *)(ulong)(uint)pDVar31->error_;
          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3d0);
          std::
          _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
          ::_M_erase((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                      *)&output_var_builtin,
                     (_Link_type)output_var_builtin._M_h._M_before_begin._M_nxt);
          goto LAB_001b7c09;
        }
LAB_001b6cc4:
        cVar57 = '\0';
        _Var9._M_nxt = input_var_builtin._M_h._M_before_begin._M_nxt;
        if ((int)uVar54 < 9) {
          uVar20 = 0;
          if (uVar54 == 2) goto LAB_001b6d20;
          if (uVar54 == 4) {
            bVar10 = EnumSet<spv::Capability>::contains
                               ((EnumSet<spv::Capability> *)local_4a0,
                                CapabilityWorkgroupMemoryExplicitLayoutKHR);
            uVar20 = 1;
            _Var9 = input_var_builtin._M_h._M_before_begin;
            if (bVar10) goto LAB_001b6d20;
          }
        }
        else {
          if ((uVar54 == 9) || (uVar54 == 0xc)) {
            uVar20 = 0;
          }
          else {
            uVar20 = 0;
            if (uVar54 != 0x14e5) goto joined_r0x001b7c1a;
          }
LAB_001b6d20:
          pIVar27 = ValidationState_t::FindDef
                              (vstate,(pIVar25->words_).
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start[1]);
          uVar4 = (pIVar27->inst_).opcode;
          if ((uVar4 != 0x20) && (uVar4 != 0x1141)) {
            __assert_fail("spv::Op::OpTypePointer == ptrInst->opcode() || spv::Op::OpTypeUntypedPointerKHR == ptrInst->opcode()"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_decorations.cpp"
                          ,0x4b7,
                          "spv_result_t spvtools::val::(anonymous namespace)::CheckDecorationsOfBuffers(ValidationState_t &)"
                         );
          }
          if (uVar3 == 0x1142) {
            puVar47 = (pIVar25->words_).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            if (0x10 < (ulong)((long)(pIVar25->words_).
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)puVar47)) {
              pMVar29 = puVar47 + 4;
              goto LAB_001b6d83;
            }
LAB_001b6dfb:
            MVar17 = kRowMajor;
          }
          else {
            pMVar29 = (pIVar27->words_).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start + 3;
LAB_001b6d83:
            MVar17 = *pMVar29;
            if (MVar17 == kRowMajor) goto LAB_001b6dfb;
            pIVar30 = ValidationState_t::FindDef(vstate,MVar17);
            if (((char)uVar20 == '\0') && (((pIVar30->inst_).opcode & 0xfffe) == 0x1c)) {
              MVar17 = Instruction::GetOperandAs<unsigned_int>(pIVar30,1);
              pIVar30 = ValidationState_t::FindDef(vstate,MVar17);
            }
            if ((pIVar30->inst_).opcode != 0x1e) {
              _Var9._M_nxt = input_var_builtin._M_h._M_before_begin._M_nxt;
              cVar57 = '\x03';
              goto joined_r0x001b7c1a;
            }
            local_3d0._0_4_ = kColumnMajor;
            local_3d0._4_4_ = 0;
            anon_unknown_0::ComputeMemberConstraintsForStruct
                      ((MemberConstraints *)&input_var_builtin,MVar17,(LayoutConstraints *)local_3d0
                       ,vstate);
          }
          local_498 = (pointer)CONCAT44(local_498._4_4_,uVar20);
          pcVar52 = "ConstantDataStorageBuffer";
          if ((char)uVar20 != '\0') {
            pcVar52 = "Function or Workgroup";
          }
          _ep_id = (pointer)(pcVar52 + 0xc);
          if (uVar54 == 9) {
            _ep_id = (pointer)0x3d460a;
          }
          pVVar43 = (ValidationState_t *)0x3d476f;
          if (uVar54 == 2) {
            _ep_id = (pointer)0x3d476f;
          }
          bVar10 = spvIsVulkanEnv(vstate->context_->target_env);
          if (bVar10) {
            bVar10 = anon_unknown_0::hasDecoration
                               ((anon_unknown_0 *)(ulong)MVar17,2,decoration_00,pVVar43);
            bVar11 = anon_unknown_0::hasDecoration
                               ((anon_unknown_0 *)(ulong)MVar17,3,decoration_00,pVVar43);
            p_Var28 = local_560;
            uVar18 = (uint32_t)local_560;
            if ((uVar54 != 0xc) || (!bVar11)) {
              if (uVar54 == 9 && !bVar10) {
                pIVar27 = ValidationState_t::FindDef(vstate,MVar17);
                ValidationState_t::diag
                          ((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_ID,pIVar27);
                ValidationState_t::VkErrorID_abi_cxx11_
                          ((string *)&output_var_builtin,vstate,0x1a13,(char *)0x0);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_3d0,(char *)output_var_builtin._M_h._M_buckets,
                           output_var_builtin._M_h._M_bucket_count);
                lVar34 = 0x11;
                pcVar52 = "PushConstant id \'";
              }
              else {
                if (uVar54 != 0xc || bVar10) {
                  pVVar43 = (ValidationState_t *)CONCAT71((int7)((ulong)pVVar43 >> 8),uVar54 != 2);
                  if ((!bVar10 && !bVar11) && uVar54 == 2) {
                    pIVar27 = ValidationState_t::FindDef(vstate,MVar17);
                    ValidationState_t::diag
                              ((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_ID,pIVar27);
                    ValidationState_t::VkErrorID_abi_cxx11_
                              ((string *)&output_var_builtin,vstate,0x1a14,(char *)0x0);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3d0,(char *)output_var_builtin._M_h._M_buckets,
                               output_var_builtin._M_h._M_bucket_count);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3d0,"Uniform id \'",0xc);
                    std::ostream::_M_insert<unsigned_long>((ulong)local_3d0);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3d0,
                               "\' is missing Block or BufferBlock decoration.\n",0x2e);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3d0,"From Vulkan spec:\n",0x12);
                    lVar34 = 0x48;
                    pcVar52 = 
                    "Such variables must be identified with a Block or BufferBlock decoration";
                    goto LAB_001b7778;
                  }
                  if ((uVar54 != 0xc) && (uVar54 != 2)) goto LAB_001b6fde;
                  ValidationState_t::EntryPointReferences
                            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                              *)&output_var_builtin,vstate,uVar18);
                  if (output_var_builtin._M_h._M_rehash_policy._M_next_resize != 0) {
                    bVar10 = anon_unknown_0::hasDecoration
                                       ((anon_unknown_0 *)((ulong)p_Var28 & 0xffffffff),0x22,
                                        decoration_00,pVVar43);
                    if (bVar10) {
                      if ((output_var_builtin._M_h._M_rehash_policy._M_next_resize == 0) ||
                         (bVar10 = anon_unknown_0::hasDecoration
                                             ((anon_unknown_0 *)((ulong)p_Var28 & 0xffffffff),0x21,
                                              decoration_00,pVVar43), bVar10)) goto LAB_001b6fc7;
                      pIVar27 = ValidationState_t::FindDef(vstate,uVar18);
                      ValidationState_t::diag
                                ((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_ID,pIVar27);
                      ValidationState_t::VkErrorID_abi_cxx11_
                                (&linkage_name,vstate,0x1a15,(char *)0x0);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3d0,linkage_name._M_dataplus._M_p,
                                 linkage_name._M_string_length);
                      pDVar31 = DiagnosticStream::operator<<
                                          ((DiagnosticStream *)local_3d0,(char **)&ep_id);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)pDVar31," id \'",5);
                      std::ostream::_M_insert<unsigned_long>((ulong)pDVar31);
                      lVar34 = 0x21;
                      pcVar52 = "\' is missing Binding decoration.\n";
                    }
                    else {
                      pIVar27 = ValidationState_t::FindDef(vstate,uVar18);
                      ValidationState_t::diag
                                ((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_ID,pIVar27);
                      ValidationState_t::VkErrorID_abi_cxx11_
                                (&linkage_name,vstate,0x1a15,(char *)0x0);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3d0,linkage_name._M_dataplus._M_p,
                                 linkage_name._M_string_length);
                      pDVar31 = DiagnosticStream::operator<<
                                          ((DiagnosticStream *)local_3d0,(char **)&ep_id);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)pDVar31," id \'",5);
                      std::ostream::_M_insert<unsigned_long>((ulong)pDVar31);
                      lVar34 = 0x27;
                      pcVar52 = "\' is missing DescriptorSet decoration.\n";
                    }
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)pDVar31,pcVar52,lVar34);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)pDVar31,"From Vulkan spec:\n",0x12);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)pDVar31,
                               "These variables must have DescriptorSet and Binding decorations specified"
                               ,0x49);
                    local_5a8 = (Instruction *)(ulong)(uint)pDVar31->error_;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)linkage_name._M_dataplus._M_p != &linkage_name.field_2) {
                      operator_delete(linkage_name._M_dataplus._M_p,
                                      CONCAT71(linkage_name.field_2._M_allocated_capacity._1_7_,
                                               linkage_name.field_2._M_local_buf[0]) + 1);
                    }
                    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3d0);
                    goto LAB_001b74e4;
                  }
LAB_001b6fc7:
                  std::
                  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                  ::_M_erase((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                              *)&output_var_builtin,
                             (_Link_type)output_var_builtin._M_h._M_before_begin._M_nxt);
                  goto LAB_001b6fde;
                }
                pIVar27 = ValidationState_t::FindDef(vstate,MVar17);
                ValidationState_t::diag
                          ((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_ID,pIVar27);
                ValidationState_t::VkErrorID_abi_cxx11_
                          ((string *)&output_var_builtin,vstate,0x1a13,(char *)0x0);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_3d0,(char *)output_var_builtin._M_h._M_buckets,
                           output_var_builtin._M_h._M_bucket_count);
                lVar34 = 0x12;
                pcVar52 = "StorageBuffer id \'";
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_3d0,pcVar52,lVar34);
              std::ostream::_M_insert<unsigned_long>((ulong)local_3d0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_3d0,"\' is missing Block decoration.\n",0x1f);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_3d0,"From Vulkan spec:\n",0x12);
              lVar34 = 0x39;
              pcVar52 = "Such variables must be identified with a Block decoration";
            }
            else {
              pIVar27 = ValidationState_t::FindDef(vstate,uVar18);
              ValidationState_t::diag
                        ((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_ID,pIVar27);
              ValidationState_t::VkErrorID_abi_cxx11_
                        ((string *)&output_var_builtin,vstate,0x1a13,(char *)0x0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_3d0,(char *)output_var_builtin._M_h._M_buckets,
                         output_var_builtin._M_h._M_bucket_count);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_3d0,"Storage buffer id \'",0x13);
              std::ostream::_M_insert<unsigned_long>((ulong)local_3d0);
              lVar34 = 0x55;
              pcVar52 = 
              " In Vulkan, BufferBlock is disallowed on variables in the StorageBuffer storage class"
              ;
            }
LAB_001b7778:
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3d0,pcVar52,lVar34);
            local_5a8 = (Instruction *)(ulong)(uint)local_200;
            if ((__node_base *)output_var_builtin._M_h._M_buckets !=
                &output_var_builtin._M_h._M_before_begin) {
              operator_delete(output_var_builtin._M_h._M_buckets,
                              (ulong)((long)&(output_var_builtin._M_h._M_before_begin._M_nxt)->
                                             _M_nxt + 1));
            }
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3d0);
            goto LAB_001b7c09;
          }
LAB_001b6fde:
          local_4c0 = pIVar25;
          if (MVar17 != kRowMajor) {
            local_3d0._0_4_ = MVar17;
            pmVar38 = std::
                      map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
                      ::operator[](local_4a8,(key_type_conflict *)local_3d0);
            p_Var39 = (pmVar38->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
            local_560 = &(pmVar38->_M_t)._M_impl.super__Rb_tree_header._M_header;
            if (p_Var39 != local_560) {
              local_410 = (ulong)local_498 & 0xff | 0x28;
              local_558 = CONCAT71(local_558._1_7_,uVar54 != 0xc && uVar54 != 0x14e5);
              do {
                bVar10 = uVar54 == 2;
                _Var6 = p_Var39[1]._M_color;
                bVar11 = _Var6 == 2;
                if ((uVar54 == 2) && (bVar58 = true, _Var6 == 3)) {
LAB_001b70fb:
                  output_var_builtin._M_h._M_buckets =
                       (__buckets_ptr)
                       CONCAT44(output_var_builtin._M_h._M_buckets._4_4_,(pIVar27->inst_).result_id)
                  ;
                  local_3d0 = (undefined1  [8])&vstate->pointer_to_storage_buffer_;
                  std::
                  _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  ::
                  _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                            ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                              *)&vstate->pointer_to_storage_buffer_,&output_var_builtin,local_3d0);
                  output_var_builtin._M_h._M_buckets =
                       (__buckets_ptr)CONCAT44(output_var_builtin._M_h._M_buckets._4_4_,MVar17);
                  local_3d0 = (undefined1  [8])__h_3;
                  uVar54 = (uint)local_550;
                  std::
                  _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  ::
                  _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                            ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                              *)__h_3,&output_var_builtin,local_3d0);
                }
                else {
                  bVar58 = bVar11;
                  if (((char)local_498 == '\0') &&
                     (((uVar54 != 9 && (uVar54 != 0x14e5)) && (uVar54 != 0xc)))) {
                    bVar58 = false;
                  }
                  if (bVar10 && bVar11) {
                    output_var_builtin._M_h._M_buckets =
                         (__buckets_ptr)
                         CONCAT44(output_var_builtin._M_h._M_buckets._4_4_,
                                  (pIVar27->inst_).result_id);
                    local_3d0 = (undefined1  [8])&vstate->pointer_to_uniform_block_;
                    std::
                    _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    ::
                    _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                              ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                                *)&vstate->pointer_to_uniform_block_,&output_var_builtin,local_3d0);
                    output_var_builtin._M_h._M_buckets =
                         (__buckets_ptr)CONCAT44(output_var_builtin._M_h._M_buckets._4_4_,MVar17);
                    local_3d0 = (undefined1  [8])__h_1;
                    uVar54 = (uint)local_550;
                    std::
                    _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    ::
                    _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                              ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                                *)__h_1,&output_var_builtin,local_3d0);
                  }
                  if (_Var6 == 2 && (char)local_558 == '\0') goto LAB_001b70fb;
                }
                if ((bool)((bVar10 && bVar11) | bVar58)) {
                  pcVar52 = "BufferBlock";
                  if (_Var6 == 2) {
                    pcVar52 = "Block";
                  }
                  bVar59 = *(bool *)((long)&(vstate->options_->universal_limits_).max_struct_members
                                    + local_410);
                  output_var_builtin._M_h._M_buckets = (__buckets_ptr)pcVar52;
                  bVar12 = anon_unknown_0::isMissingOffsetInStruct(MVar17,vstate);
                  if (bVar12) {
                    pIVar27 = ValidationState_t::FindDef(vstate,MVar17);
                    ValidationState_t::diag
                              ((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_ID,pIVar27);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3d0,"Structure id ",0xd);
                    std::ostream::_M_insert<unsigned_long>((ulong)local_3d0);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3d0," decorated as ",0xe);
                    pDVar31 = DiagnosticStream::operator<<
                                        ((DiagnosticStream *)local_3d0,(char **)&output_var_builtin)
                    ;
                    lVar34 = 0x35;
                    pcVar52 = " must be explicitly laid out with Offset decorations.";
LAB_001b7be1:
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)pDVar31,pcVar52,lVar34);
                    sVar22 = pDVar31->error_;
                    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3d0);
                  }
                  else {
                    k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int>.
                    super__Tuple_impl<1UL,_unsigned_int>.super__Head_base<1UL,_unsigned_int,_false>.
                    _M_head_impl = (_Head_base<1UL,_unsigned_int,_false>)0x0;
                    k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int>.
                    super__Head_base<0UL,_spv::Decoration,_false>._M_head_impl =
                         DecorationRelaxedPrecision;
                    auStack_4f0._0_8_ = (pointer)0x0;
                    local_4e0 = std::
                                _Function_handler<bool_(spv::Decoration),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_decorations.cpp:1329:23)>
                                ::_M_invoke;
                    auStack_4f0._8_8_ =
                         std::
                         _Function_handler<bool_(spv::Decoration),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_decorations.cpp:1329:23)>
                         ::_M_manager;
                    bVar12 = anon_unknown_0::checkForRequiredDecoration
                                       (MVar17,(function<bool_(spv::Decoration)> *)&k,OpTypeArray,
                                        vstate);
                    if ((code *)auStack_4f0._8_8_ != (code *)0x0) {
                      (*(code *)auStack_4f0._8_8_)
                                ((function<bool_(spv::Decoration)> *)&k,
                                 (function<bool_(spv::Decoration)> *)&k,3);
                    }
                    uVar54 = (uint)local_550;
                    if (!bVar12) {
                      pIVar27 = ValidationState_t::FindDef(vstate,MVar17);
                      ValidationState_t::diag
                                ((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_ID,pIVar27);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3d0,"Structure id ",0xd);
                      std::ostream::_M_insert<unsigned_long>((ulong)local_3d0);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3d0," decorated as ",0xe);
                      pDVar31 = DiagnosticStream::operator<<
                                          ((DiagnosticStream *)local_3d0,
                                           (char **)&output_var_builtin);
                      lVar34 = 0x3a;
                      pcVar52 = " must be explicitly laid out with ArrayStride decorations.";
                      goto LAB_001b7be1;
                    }
                    _builtin = (void *)0x0;
                    vStack_450.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                    vStack_450.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage =
                         (pointer)std::
                                  _Function_handler<bool_(spv::Decoration),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_decorations.cpp:1341:23)>
                                  ::_M_invoke;
                    vStack_450.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish =
                         (pointer)std::
                                  _Function_handler<bool_(spv::Decoration),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_decorations.cpp:1341:23)>
                                  ::_M_manager;
                    bVar12 = anon_unknown_0::checkForRequiredDecoration
                                       (MVar17,(function<bool_(spv::Decoration)> *)&builtin,
                                        OpTypeMatrix,vstate);
                    if ((code *)vStack_450.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish != (code *)0x0) {
                      (*(code *)vStack_450.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish)
                                ((_Any_data *)&builtin,(_Any_data *)&builtin,__destroy_functor);
                    }
                    if (!bVar12) {
                      pIVar27 = ValidationState_t::FindDef(vstate,MVar17);
                      ValidationState_t::diag
                                ((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_ID,pIVar27);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3d0,"Structure id ",0xd);
                      std::ostream::_M_insert<unsigned_long>((ulong)local_3d0);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3d0," decorated as ",0xe);
                      pDVar31 = DiagnosticStream::operator<<
                                          ((DiagnosticStream *)local_3d0,
                                           (char **)&output_var_builtin);
                      lVar34 = 0x3b;
                      pcVar52 = " must be explicitly laid out with MatrixStride decorations.";
                      goto LAB_001b7be1;
                    }
                    local_3f8._M_unused._M_object = (void *)0x0;
                    local_3f8._8_8_ = 0;
                    local_3e0 = std::
                                _Function_handler<bool_(spv::Decoration),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_decorations.cpp:1353:23)>
                                ::_M_invoke;
                    local_3e8 = std::
                                _Function_handler<bool_(spv::Decoration),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_decorations.cpp:1353:23)>
                                ::_M_manager;
                    bVar12 = anon_unknown_0::checkForRequiredDecoration
                                       (MVar17,(function<bool_(spv::Decoration)> *)&local_3f8,
                                        OpTypeMatrix,vstate);
                    if (local_3e8 != (code *)0x0) {
                      (*local_3e8)(&local_3f8,&local_3f8,__destroy_functor);
                    }
                    if (!bVar12) {
                      pIVar27 = ValidationState_t::FindDef(vstate,MVar17);
                      ValidationState_t::diag
                                ((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_ID,pIVar27);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3d0,"Structure id ",0xd);
                      std::ostream::_M_insert<unsigned_long>((ulong)local_3d0);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3d0," decorated as ",0xe);
                      pDVar31 = DiagnosticStream::operator<<
                                          ((DiagnosticStream *)local_3d0,
                                           (char **)&output_var_builtin);
                      lVar34 = 0x43;
                      pcVar52 = 
                      " must be explicitly laid out with RowMajor or ColMajor decorations.";
                      goto LAB_001b7be1;
                    }
                    bVar12 = spvIsVulkanEnv(vstate->context_->target_env);
                    if ((!bVar12) ||
                       (((!bVar10 || !bVar11 ||
                         (sVar22 = anon_unknown_0::checkLayout
                                             (MVar17,(char *)_ep_id,
                                              (char *)output_var_builtin._M_h._M_buckets,true,bVar59
                                              ,0,(MemberConstraints *)&input_var_builtin,vstate),
                         sVar22 == SPV_SUCCESS)) &&
                        ((!bVar58 ||
                         (sVar22 = anon_unknown_0::checkLayout
                                             (MVar17,(char *)_ep_id,
                                              (char *)output_var_builtin._M_h._M_buckets,false,
                                              bVar59,0,(MemberConstraints *)&input_var_builtin,
                                              vstate), sVar22 == SPV_SUCCESS))))))
                    goto LAB_001b738d;
                  }
                  local_5a8 = (Instruction *)(ulong)(uint)sVar22;
                  pIVar50 = local_4b8;
                  pIVar25 = local_4c0;
                  goto LAB_001b7c09;
                }
LAB_001b738d:
                p_Var39 = (_Base_ptr)std::_Rb_tree_increment(p_Var39);
              } while (p_Var39 != local_560);
            }
          }
          _Var9._M_nxt = input_var_builtin._M_h._M_before_begin._M_nxt;
          cVar57 = '\0';
          pIVar25 = local_4c0;
          pIVar50 = local_4b8;
        }
      }
joined_r0x001b7c1a:
      while (_Var9._M_nxt != (_Hash_node_base *)0x0) {
        p_Var51 = (_Var9._M_nxt)->_M_nxt;
        operator_delete(_Var9._M_nxt,0x20);
        _Var9._M_nxt = p_Var51;
      }
      memset(input_var_builtin._M_h._M_buckets,0,input_var_builtin._M_h._M_bucket_count << 3);
      input_var_builtin._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      input_var_builtin._M_h._M_element_count = 0;
      if (&input_var_builtin._M_h._M_single_bucket != input_var_builtin._M_h._M_buckets) {
        operator_delete(input_var_builtin._M_h._M_buckets,
                        input_var_builtin._M_h._M_bucket_count << 3);
      }
      if ((cVar57 != '\x03') && (cVar57 != '\0')) {
        std::
        _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       *)&seen_vars);
        if ((spv_result_t)local_5a8 != SPV_SUCCESS) {
          return (spv_result_t)local_5a8;
        }
        goto LAB_001b7f6b;
      }
      pIVar25 = pIVar25 + 1;
    } while (pIVar25 != pIVar50);
  }
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&seen_vars);
LAB_001b7f6b:
  seen_vars._M_h._M_element_count = (size_type)&seen_vars._M_h._M_bucket_count;
  sVar22 = SPV_SUCCESS;
  seen_vars._M_h._M_bucket_count = seen_vars._M_h._M_bucket_count & 0xffffffff00000000;
  seen_vars._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  seen_vars._M_h._M_rehash_policy._M_next_resize = 0;
  input_var_builtin._M_h._M_element_count = (size_type)&input_var_builtin._M_h._M_bucket_count;
  input_var_builtin._M_h._M_bucket_count =
       input_var_builtin._M_h._M_bucket_count & 0xffffffff00000000;
  input_var_builtin._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  input_var_builtin._M_h._M_rehash_policy._M_next_resize = 0;
  pIVar25 = (vstate->ordered_instructions_).
            super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pIVar50 = (vstate->ordered_instructions_).
            super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  input_var_builtin._M_h._M_rehash_policy._0_8_ = input_var_builtin._M_h._M_element_count;
  seen_vars._M_h._M_rehash_policy._0_8_ = seen_vars._M_h._M_element_count;
  if (pIVar25 != pIVar50) {
    do {
      uVar3 = (pIVar25->inst_).opcode;
      if (uVar3 == 0x48) {
        puVar47 = (pIVar25->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        id._M_head_impl = puVar47[1];
        _Var5._M_head_impl = ((_Head_base<1UL,_unsigned_int,_false> *)(puVar47 + 2))->_M_head_impl;
        uVar18 = puVar47[3];
        k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int>.
        super__Head_base<0UL,_spv::Decoration,_false>._M_head_impl = id._M_head_impl;
        k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int>.super__Tuple_impl<1UL,_unsigned_int>
        .super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
             (_Head_base<1UL,_unsigned_int,_false>)
             (_Head_base<1UL,_unsigned_int,_false>)_Var5._M_head_impl;
        auStack_4f0._0_4_ = uVar18;
        pVar64 = std::
                 _Rb_tree<std::tuple<spv::Decoration,unsigned_int,unsigned_int>,std::tuple<spv::Decoration,unsigned_int,unsigned_int>,std::_Identity<std::tuple<spv::Decoration,unsigned_int,unsigned_int>>,std::less<std::tuple<spv::Decoration,unsigned_int,unsigned_int>>,std::allocator<std::tuple<spv::Decoration,unsigned_int,unsigned_int>>>
                 ::_M_insert_unique<std::tuple<spv::Decoration,unsigned_int,unsigned_int>const&>
                           ((_Rb_tree<std::tuple<spv::Decoration,unsigned_int,unsigned_int>,std::tuple<spv::Decoration,unsigned_int,unsigned_int>,std::_Identity<std::tuple<spv::Decoration,unsigned_int,unsigned_int>>,std::less<std::tuple<spv::Decoration,unsigned_int,unsigned_int>>,std::allocator<std::tuple<spv::Decoration,unsigned_int,unsigned_int>>>
                             *)&input_var_builtin,
                            (tuple<spv::Decoration,_unsigned_int,_unsigned_int> *)&k);
        if ((((undefined1  [16])pVar64 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (uVar18 != 0x1603)) {
          pIVar27 = ValidationState_t::FindDef(vstate,id._M_head_impl);
          ValidationState_t::diag((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_ID,pIVar27)
          ;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3d0,"ID \'",4);
          std::ostream::_M_insert<unsigned_long>((ulong)local_3d0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_3d0,"\', member \'",0xb);
          std::ostream::_M_insert<unsigned_long>((ulong)local_3d0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_3d0,"\' decorated with ",0x11);
          ValidationState_t::SpvDecorationString_abi_cxx11_
                    ((string *)&output_var_builtin,vstate,uVar18);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_3d0,(char *)output_var_builtin._M_h._M_buckets,
                     output_var_builtin._M_h._M_bucket_count);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_3d0," multiple times is not allowed.",0x1f);
          sVar22 = local_200;
        }
        else {
          if (uVar18 == 4) {
            uVar20 = 5;
          }
          else {
            if (uVar18 != 5) goto LAB_001b8134;
            uVar20 = 4;
          }
          _Stack_454._M_head_impl = id._M_head_impl;
          builtin = _Var5._M_head_impl;
          local_550 = CONCAT44(local_550._4_4_,uVar20);
          vStack_450.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44(vStack_450.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,uVar20);
          iVar35 = std::
                   _Rb_tree<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>,_std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>,_std::_Identity<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>_>,_std::less<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>_>,_std::allocator<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>_>_>
                   ::find((_Rb_tree<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>,_std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>,_std::_Identity<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>_>,_std::less<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>_>,_std::allocator<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>_>_>
                           *)&input_var_builtin,(key_type *)&builtin);
          if (iVar35._M_node == (_Base_ptr)&input_var_builtin._M_h._M_bucket_count)
          goto LAB_001b8134;
          pIVar27 = ValidationState_t::FindDef(vstate,id._M_head_impl);
          ValidationState_t::diag((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_ID,pIVar27)
          ;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3d0,"ID \'",4);
          std::ostream::_M_insert<unsigned_long>((ulong)local_3d0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_3d0,"\', member \'",0xb);
          std::ostream::_M_insert<unsigned_long>((ulong)local_3d0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_3d0,"\' decorated with both ",0x16);
          ValidationState_t::SpvDecorationString_abi_cxx11_
                    ((string *)&output_var_builtin,vstate,uVar18);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_3d0,(char *)output_var_builtin._M_h._M_buckets,
                     output_var_builtin._M_h._M_bucket_count);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3d0," and ",5);
          uVar18 = (uint)local_550;
LAB_001b81f1:
          ValidationState_t::SpvDecorationString_abi_cxx11_(&linkage_name,vstate,uVar18);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_3d0,linkage_name._M_dataplus._M_p,
                     linkage_name._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_3d0," is not allowed.",0x10);
          sVar22 = local_200;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)linkage_name._M_dataplus._M_p != &linkage_name.field_2) {
            operator_delete(linkage_name._M_dataplus._M_p,
                            CONCAT71(linkage_name.field_2._M_allocated_capacity._1_7_,
                                     linkage_name.field_2._M_local_buf[0]) + 1);
          }
        }
        if ((__node_base *)output_var_builtin._M_h._M_buckets !=
            &output_var_builtin._M_h._M_before_begin) {
          operator_delete(output_var_builtin._M_h._M_buckets,
                          (ulong)((long)&(output_var_builtin._M_h._M_before_begin._M_nxt)->_M_nxt +
                                 1));
        }
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3d0);
        goto LAB_001b826c;
      }
      if (uVar3 == 0x47) {
        puVar47 = (pIVar25->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        p_Var1 = (_Tuple_impl<0UL,_spv::Decoration,_unsigned_int> *)(puVar47 + 1);
        uVar16 = (p_Var1->super__Tuple_impl<1UL,_unsigned_int>).
                 super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
        decoration = puVar47[2];
        k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int> = *p_Var1;
        pVar63 = std::
                 _Rb_tree<std::tuple<spv::Decoration,unsigned_int>,std::tuple<spv::Decoration,unsigned_int>,std::_Identity<std::tuple<spv::Decoration,unsigned_int>>,std::less<std::tuple<spv::Decoration,unsigned_int>>,std::allocator<std::tuple<spv::Decoration,unsigned_int>>>
                 ::_M_insert_unique<std::tuple<spv::Decoration,unsigned_int>const&>
                           ((_Rb_tree<std::tuple<spv::Decoration,unsigned_int>,std::tuple<spv::Decoration,unsigned_int>,std::_Identity<std::tuple<spv::Decoration,unsigned_int>>,std::less<std::tuple<spv::Decoration,unsigned_int>>,std::allocator<std::tuple<spv::Decoration,unsigned_int>>>
                             *)&seen_vars,&k);
        if (((((undefined1  [16])pVar63 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (decoration != 0x26)) && (decoration != 0x1603)) {
          pIVar27 = ValidationState_t::FindDef(vstate,uVar16);
          ValidationState_t::diag((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_ID,pIVar27)
          ;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3d0,"ID \'",4);
          std::ostream::_M_insert<unsigned_long>((ulong)local_3d0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_3d0,"\' decorated with ",0x11);
          ValidationState_t::SpvDecorationString_abi_cxx11_
                    ((string *)&output_var_builtin,vstate,decoration);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_3d0,(char *)output_var_builtin._M_h._M_buckets,
                     output_var_builtin._M_h._M_bucket_count);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_3d0," multiple times is not allowed.",0x1f);
          sVar22 = local_200;
          if ((__node_base *)output_var_builtin._M_h._M_buckets !=
              &output_var_builtin._M_h._M_before_begin) {
            operator_delete(output_var_builtin._M_h._M_buckets,
                            (ulong)((long)&(output_var_builtin._M_h._M_before_begin._M_nxt)->_M_nxt
                                   + 1));
          }
          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3d0);
          goto LAB_001b826c;
        }
        lVar34 = 0;
        bVar10 = true;
        do {
          bVar11 = bVar10;
          uVar18 = (&DAT_003b9484)[lVar34 * 2];
          if (((&(anonymous_namespace)::
                 CheckDecorationsCompatibility(spvtools::val::ValidationState_t&)::
                 mutually_exclusive_per_id)[lVar34 * 2] == decoration) ||
             (bVar10 = uVar18 == decoration,
             uVar18 = (&(anonymous_namespace)::
                        CheckDecorationsCompatibility(spvtools::val::ValidationState_t&)::
                        mutually_exclusive_per_id)[lVar34 * 2], bVar10)) {
            _Stack_454._M_head_impl = uVar18;
            builtin = uVar16;
            iVar33 = std::
                     _Rb_tree<std::tuple<spv::Decoration,_unsigned_int>,_std::tuple<spv::Decoration,_unsigned_int>,_std::_Identity<std::tuple<spv::Decoration,_unsigned_int>_>,_std::less<std::tuple<spv::Decoration,_unsigned_int>_>,_std::allocator<std::tuple<spv::Decoration,_unsigned_int>_>_>
                     ::find((_Rb_tree<std::tuple<spv::Decoration,_unsigned_int>,_std::tuple<spv::Decoration,_unsigned_int>,_std::_Identity<std::tuple<spv::Decoration,_unsigned_int>_>,_std::less<std::tuple<spv::Decoration,_unsigned_int>_>,_std::allocator<std::tuple<spv::Decoration,_unsigned_int>_>_>
                             *)&seen_vars,(key_type *)&builtin);
            if (iVar33._M_node != (_Base_ptr)&seen_vars._M_h._M_bucket_count) {
              pIVar27 = ValidationState_t::FindDef(vstate,uVar16);
              ValidationState_t::diag
                        ((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_ID,pIVar27);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3d0,"ID \'",4);
              std::ostream::_M_insert<unsigned_long>((ulong)local_3d0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_3d0,"\' decorated with both ",0x16);
              ValidationState_t::SpvDecorationString_abi_cxx11_
                        ((string *)&output_var_builtin,vstate,decoration);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_3d0,(char *)output_var_builtin._M_h._M_buckets,
                         output_var_builtin._M_h._M_bucket_count);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3d0," and ",5);
              goto LAB_001b81f1;
            }
          }
          lVar34 = 1;
          bVar10 = false;
        } while (bVar11);
      }
LAB_001b8134:
      pIVar25 = pIVar25 + 1;
    } while (pIVar25 != pIVar50);
    sVar22 = SPV_SUCCESS;
  }
LAB_001b826c:
  std::
  _Rb_tree<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>,_std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>,_std::_Identity<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>_>,_std::less<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>_>,_std::allocator<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>_>_>
  ::_M_erase((_Rb_tree<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>,_std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>,_std::_Identity<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>_>,_std::less<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>_>,_std::allocator<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>_>_>
              *)&input_var_builtin,(_Link_type)input_var_builtin._M_h._M_before_begin._M_nxt);
  std::
  _Rb_tree<std::tuple<spv::Decoration,_unsigned_int>,_std::tuple<spv::Decoration,_unsigned_int>,_std::_Identity<std::tuple<spv::Decoration,_unsigned_int>_>,_std::less<std::tuple<spv::Decoration,_unsigned_int>_>,_std::allocator<std::tuple<spv::Decoration,_unsigned_int>_>_>
  ::_M_erase((_Rb_tree<std::tuple<spv::Decoration,_unsigned_int>,_std::tuple<spv::Decoration,_unsigned_int>,_std::_Identity<std::tuple<spv::Decoration,_unsigned_int>_>,_std::less<std::tuple<spv::Decoration,_unsigned_int>_>,_std::allocator<std::tuple<spv::Decoration,_unsigned_int>_>_>
              *)&seen_vars,(_Link_type)seen_vars._M_h._M_before_begin._M_nxt);
  if (sVar22 == SPV_SUCCESS) {
    pvVar36 = ValidationState_t::functions(vstate);
    pFVar8 = (pvVar36->
             super__Vector_base<spvtools::val::Function,_std::allocator<spvtools::val::Function>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    for (this_01 = (pvVar36->
                   super__Vector_base<spvtools::val::Function,_std::allocator<spvtools::val::Function>_>
                   )._M_impl.super__Vector_impl_data._M_start; this_01 != pFVar8;
        this_01 = this_01 + 1) {
      sVar37 = Function::block_count(this_01);
      bVar10 = anon_unknown_0::hasImportLinkageAttribute(this_01->id_,vstate);
      if (sVar37 == 0) {
        if (!bVar10) {
          pIVar27 = ValidationState_t::FindDef(vstate,this_01->id_);
          ValidationState_t::diag
                    ((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_BINARY,pIVar27);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_3d0,"Function declaration (id ",0x19);
          std::ostream::_M_insert<unsigned_long>((ulong)local_3d0);
          pcVar52 = ") must have a LinkageAttributes decoration with the Import Linkage type.";
          lVar34 = 0x48;
          goto LAB_001b83a2;
        }
      }
      else if (bVar10) {
        pIVar27 = ValidationState_t::FindDef(vstate,this_01->id_);
        ValidationState_t::diag
                  ((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_BINARY,pIVar27);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_3d0,"Function definition (id ",0x18);
        std::ostream::_M_insert<unsigned_long>((ulong)local_3d0);
        pcVar52 = ") may not be decorated with Import Linkage type.";
        lVar34 = 0x30;
LAB_001b83a2:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3d0,pcVar52,lVar34);
        sVar22 = local_200;
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3d0);
        if (sVar22 != SPV_SUCCESS) {
          return sVar22;
        }
        break;
      }
    }
    MVar21 = ValidationState_t::memory_model(vstate);
    if (MVar21 == MemoryModelVulkan) {
      input_var_builtin._M_h._M_buckets = &input_var_builtin._M_h._M_before_begin._M_nxt;
      input_var_builtin._M_h._M_bucket_count = 0;
      input_var_builtin._M_h._M_before_begin._M_nxt =
           input_var_builtin._M_h._M_before_begin._M_nxt & 0xffffffffffffff00;
      std::__cxx11::ostringstream::ostringstream
                ((ostringstream *)&seen_vars,(string *)&input_var_builtin,_S_out);
      p_Var51 = (vstate->all_definitions_)._M_h._M_before_begin._M_nxt;
      sVar22 = SPV_SUCCESS;
      if (p_Var51 != (_Hash_node_base *)0x0) {
        do {
          pIVar27 = (Instruction *)p_Var51[2]._M_nxt;
          MVar17 = (pIVar27->inst_).result_id;
          local_3d0._0_4_ = MVar17;
          pmVar38 = std::
                    map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
                    ::operator[](&vstate->id_decorations_,(key_type_conflict *)local_3d0);
          for (p_Var39 = (pmVar38->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var39 != &(pmVar38->_M_t)._M_impl.super__Rb_tree_header;
              p_Var39 = (_Base_ptr)std::_Rb_tree_increment(p_Var39)) {
            if ((p_Var39[1]._M_color | 2) == 0x17) {
              _Var6 = p_Var39[2]._M_color;
              pcVar52 = "Volatile";
              if (p_Var39[1]._M_color == 0x17) {
                pcVar52 = "Coherent";
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&seen_vars,pcVar52,8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&seen_vars," decoration targeting ",0x16);
              ValidationState_t::getIdName_abi_cxx11_((string *)local_3d0,vstate,MVar17);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&seen_vars,(char *)local_3d0,local_3c8._0_8_);
              if (local_3d0 != (undefined1  [8])((long)local_3c8 + 8)) {
                operator_delete((void *)local_3d0,local_3c8._8_8_ + 1);
              }
              if (_Var6 != ~_S_red) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&seen_vars," (member index ",0xf);
                poVar40 = (ostream *)std::ostream::operator<<((ostream *)&seen_vars,_Var6);
                std::__ostream_insert<char,std::char_traits<char>>(poVar40,")",1);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&seen_vars," is banned when using the Vulkan memory model.",0x2e
                        );
              ValidationState_t::diag
                        ((DiagnosticStream *)local_3d0,vstate,SPV_ERROR_INVALID_ID,pIVar27);
              std::__cxx11::stringbuf::str();
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_3d0,(char *)output_var_builtin._M_h._M_buckets,
                         output_var_builtin._M_h._M_bucket_count);
              if ((__node_base *)output_var_builtin._M_h._M_buckets !=
                  &output_var_builtin._M_h._M_before_begin) {
                operator_delete(output_var_builtin._M_h._M_buckets,
                                (ulong)((long)&(output_var_builtin._M_h._M_before_begin._M_nxt)->
                                               _M_nxt + 1));
              }
              DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3d0);
              sVar22 = local_200;
              goto LAB_001b85ec;
            }
          }
          p_Var51 = p_Var51->_M_nxt;
        } while (p_Var51 != (_Hash_node_base *)0x0);
      }
LAB_001b85ec:
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&seen_vars);
      std::ios_base::~ios_base(local_138);
      if ((__node_base *)input_var_builtin._M_h._M_buckets !=
          &input_var_builtin._M_h._M_before_begin) {
        operator_delete(input_var_builtin._M_h._M_buckets,
                        (ulong)((long)&(input_var_builtin._M_h._M_before_begin._M_nxt)->_M_nxt + 1))
        ;
      }
      if (sVar22 != SPV_SUCCESS) {
        return sVar22;
      }
    }
    sVar22 = anon_unknown_0::CheckDecorationsFromDecoration(vstate);
  }
  return sVar22;
}

Assistant:

spv_result_t ValidateDecorations(ValidationState_t& vstate) {
  if (auto error = CheckImportedVariableInitialization(vstate)) return error;
  if (auto error = CheckDecorationsOfEntryPoints(vstate)) return error;
  if (auto error = CheckDecorationsOfBuffers(vstate)) return error;
  if (auto error = CheckDecorationsCompatibility(vstate)) return error;
  if (auto error = CheckLinkageAttrOfFunctions(vstate)) return error;
  if (auto error = CheckVulkanMemoryModelDeprecatedDecorations(vstate))
    return error;
  if (auto error = CheckDecorationsFromDecoration(vstate)) return error;
  return SPV_SUCCESS;
}